

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall glslang::HlslGrammar::acceptDefaultLabel(HlslGrammar *this,TIntermNode **statement)

{
  bool bVar1;
  TIntermBranch *pTVar2;
  TSourceLoc loc;
  TSourceLoc local_28;
  
  local_28.column = (this->super_HlslTokenStream).token.loc.column;
  local_28._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
  local_28.name = (this->super_HlslTokenStream).token.loc.name;
  local_28.string = (this->super_HlslTokenStream).token.loc.string;
  local_28.line = (this->super_HlslTokenStream).token.loc.line;
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokDefault);
  if (bVar1) {
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokColon);
    if (bVar1) {
      pTVar2 = TIntermediate::addBranch
                         ((this->parseContext->super_TParseContextBase).super_TParseVersions.
                          intermediate,EOpDefault,&local_28);
      *statement = &pTVar2->super_TIntermNode;
      return true;
    }
    expected(this,":");
  }
  return false;
}

Assistant:

bool HlslGrammar::acceptDefaultLabel(TIntermNode*& statement)
{
    TSourceLoc loc = token.loc;
    if (! acceptTokenClass(EHTokDefault))
        return false;

    if (! acceptTokenClass(EHTokColon)) {
        expected(":");
        return false;
    }

    statement = parseContext.intermediate.addBranch(EOpDefault, loc);

    return true;
}